

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

bool __thiscall FIX::SessionState::timedOut(SessionState *this,UtcTimeStamp *now)

{
  int iVar1;
  int iVar2;
  
  iVar1 = operator-(&now->super_DateTime,&(this->m_lastReceivedTime).super_DateTime);
  iVar2 = IntField::getValue(&(this->m_heartBtInt).super_IntField);
  return (double)iVar2 * 2.4 <= (double)iVar1;
}

Assistant:

bool timedOut(const UtcTimeStamp &now) const { return (now - lastReceivedTime()) >= (2.4 * (double)heartBtInt()); }